

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenSubdir(InMemoryDirectory *this,PathPtr path)

{
  size_t sVar1;
  Impl *pIVar2;
  String *pSVar3;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *pOVar4;
  ReadableDirectory *pRVar5;
  int in_ECX;
  void *__child_stack;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  void *in_R8;
  PathPtr PVar6;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar7;
  StringPtr name;
  StringPtr name_00;
  Own<const_kj::ReadableDirectory,_std::nullptr_t> *subdir;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> _subdir1109;
  EntryImpl *entry;
  undefined1 local_70 [16];
  EntryImpl *_entry1103;
  undefined1 local_58 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Own<const_kj::Directory,_std::nullptr_t> local_38;
  undefined8 local_28;
  InMemoryDirectory *this_local;
  PathPtr path_local;
  
  this_local = (InMemoryDirectory *)path.parts.size_;
  name_00.content.ptr =
       (Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr;
  local_28 = name_00.content.ptr;
  path_local.parts.size_ = (size_t)this;
  sVar1 = PathPtr::size((PathPtr *)&this_local);
  if (sVar1 == 0) {
    Directory::clone((Directory *)&local_38,(__fn *)name_00.content.ptr,__child_stack,in_ECX,in_R8);
    Maybe<kj::Own<kj::ReadableDirectory_const,decltype(nullptr)>>::Maybe<kj::Directory_const>
              ((Maybe<kj::Own<kj::ReadableDirectory_const,decltype(nullptr)>> *)this,&local_38);
    Own<const_kj::Directory,_std::nullptr_t>::~Own(&local_38);
    pRVar5 = extraout_RDX;
  }
  else {
    sVar1 = PathPtr::size((PathPtr *)&this_local);
    if (sVar1 == 1) {
      MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58,
                 &name_00.content.ptr[1].ptr);
      pIVar2 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->
                         ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                          local_58);
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&entry,pSVar3);
      name.content.size_ = (size_t)entry;
      name.content.ptr = (char *)pIVar2;
      Impl::tryGetEntry((Impl *)local_70,name);
      local_70._8_8_ =
           kj::_::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_70);
      if ((EntryImpl *)local_70._8_8_ == (EntryImpl *)0x0) {
        Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)this);
      }
      else {
        asDirectory(this,name_00.content.ptr,(EntryImpl *)local_58);
      }
      _subdir1109.value.ptr._4_4_ = 1;
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_58);
      pRVar5 = extraout_RDX_00;
    }
    else {
      pSVar3 = PathPtr::operator[]((PathPtr *)&this_local,0);
      StringPtr::StringPtr((StringPtr *)&subdir,pSVar3);
      name_00.content.size_ = (size_t)subdir;
      tryGetParent((InMemoryDirectory *)local_b0,name_00);
      kj::_::readMaybe<kj::ReadableDirectory_const,decltype(nullptr)>
                ((_ *)local_a0,
                 (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe
                ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)local_b0);
      pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_a0);
      if (pOVar4 == (Own<const_kj::ReadableDirectory,_std::nullptr_t> *)0x0) {
        Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::Maybe
                  ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)this);
      }
      else {
        pOVar4 = kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::operator*
                           ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
        pRVar5 = Own<const_kj::ReadableDirectory,_std::nullptr_t>::operator->(pOVar4);
        sVar1 = PathPtr::size((PathPtr *)&this_local);
        PVar6 = PathPtr::slice((PathPtr *)&this_local,1,sVar1);
        (*(pRVar5->super_FsNode)._vptr_FsNode[0xb])(this,pRVar5,PVar6.parts.ptr,PVar6.parts.size_);
      }
      _subdir1109.value.ptr._4_4_ = 1;
      kj::_::OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t>::~OwnOwn
                ((OwnOwn<const_kj::ReadableDirectory,_std::nullptr_t> *)local_a0);
      pRVar5 = extraout_RDX_01;
    }
  }
  MVar7.ptr.ptr = pRVar5;
  MVar7.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar7.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const override {
    if (path.size() == 0) {
      return clone();
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asDirectory(lock, entry);
      } else {
        return kj::none;
      }
    }